

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

vm_obj_id_t CVmObjIterLookupTable::create_for_coll(vm_val_t *coll)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t obj_id;
  CVmObjIterLookupTable *this;
  
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&coll->field_0x4;
  aVar1 = coll->val;
  sp_ = sp_ + 1;
  pvVar3->typ = coll->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  obj_id = vm_new_id(0,1,1);
  this = (CVmObjIterLookupTable *)CVmObject::operator_new(0x10,obj_id);
  CVmObjIterLookupTable(this,coll);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjIterLookupTable::create_for_coll(VMG_ const vm_val_t *coll)
{
    vm_obj_id_t id;

    /* push the collection object reference for gc protection */
    G_stk->push(coll);

    /* create a non-root-set object */
    id = vm_new_id(vmg_ FALSE, TRUE, TRUE);

    /* instantiate the iterator */
    new (vmg_ id) CVmObjIterLookupTable(vmg_ coll);

    /* done with the gc protection */
    G_stk->discard();

    /* return the new object's ID */
    return id;
}